

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O2

Unique<Type>_conflict6 __thiscall
anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>::load
          (Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_> *this,Model *model,Json *source)

{
  const_reference pvVar1;
  Ref<anurbs::NurbsCurveGeometry<2L>_> geometry;
  Interval domain;
  allocator<char> local_79;
  key_type local_78;
  undefined1 local_58 [16];
  Interval local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"geometry",(allocator<char> *)&local_48);
  pvVar1 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(source,&local_78);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_38,pvVar1);
  Model::get_lazy<anurbs::NurbsCurveGeometry<2l>>((Model *)local_58,(string *)model);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"domain",&local_79);
  pvVar1 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(source,&local_78);
  local_48 = nlohmann::
             basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::get<anurbs::Interval,_anurbs::Interval,_0>(pvVar1);
  std::__cxx11::string::~string((string *)&local_78);
  new_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>const&,anurbs::Interval_const&>
            ((anurbs *)this,(Ref<anurbs::NurbsCurveGeometry<2L>_> *)local_58,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return (__uniq_ptr_data<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_std::default_delete<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_std::default_delete<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Type> load(Model& model, const Json& source)
    {
        const auto geometry = model.get_lazy<NurbsCurveGeometry<TDimension>>(
            source.at("geometry"));

        const Interval domain = source.at("domain");

        return new_<Type>(geometry, domain);
    }